

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactBundleDirNameTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactBundleDirNameTag> *this,
          cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content)

{
  bool bVar1;
  string config;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"TARGET_BUNDLE_DIR_NAME not allowed for IMPORTED targets.",
               &local_61);
    reportError((cmGeneratorExpressionContext *)target,&local_60,&local_40);
  }
  else {
    bVar1 = cmGeneratorTarget::IsBundleOnApple((cmGeneratorTarget *)this);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_60,
                 (string *)&(target->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                );
      bVar1 = cmGeneratorTarget::IsAppBundleOnApple((cmGeneratorTarget *)this);
      if (bVar1) {
        cmGeneratorTarget::GetAppBundleDirectory
                  (__return_storage_ptr__,(cmGeneratorTarget *)this,&local_60,BundleDirLevel);
      }
      else {
        bVar1 = cmGeneratorTarget::IsFrameworkOnApple((cmGeneratorTarget *)this);
        if (bVar1) {
          cmGeneratorTarget::GetFrameworkDirectory
                    (__return_storage_ptr__,(cmGeneratorTarget *)this,&local_60,BundleDirLevel);
        }
        else {
          bVar1 = cmGeneratorTarget::IsCFBundleOnApple((cmGeneratorTarget *)this);
          if (bVar1) {
            cmGeneratorTarget::GetCFBundleDirectory
                      (__return_storage_ptr__,(cmGeneratorTarget *)this,&local_60,BundleDirLevel);
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_60);
      return __return_storage_ptr__;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"TARGET_BUNDLE_DIR_NAME is allowed only for Bundle targets.",
               &local_61);
    reportError((cmGeneratorExpressionContext *)target,&local_60,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    if (target->IsImported()) {
      ::reportError(
        context, content->GetOriginalExpression(),
        "TARGET_BUNDLE_DIR_NAME not allowed for IMPORTED targets.");
      return std::string();
    }
    if (!target->IsBundleOnApple()) {
      ::reportError(
        context, content->GetOriginalExpression(),
        "TARGET_BUNDLE_DIR_NAME is allowed only for Bundle targets.");
      return std::string();
    }

    auto level = cmGeneratorTarget::BundleDirLevel;
    auto config = context->Config;
    if (target->IsAppBundleOnApple()) {
      return target->GetAppBundleDirectory(config, level);
    }
    if (target->IsFrameworkOnApple()) {
      return target->GetFrameworkDirectory(config, level);
    }
    if (target->IsCFBundleOnApple()) {
      return target->GetCFBundleDirectory(config, level);
    }
    return std::string();
  }